

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O3

void CProfileManager::Reset(void)

{
  timeval currentTime;
  timeval local_18;
  
  gettimeofday((timeval *)gProfileClock.m_data,(__timezone_ptr_t)0x0);
  CProfileNode::Reset(&Root);
  CProfileNode::Call(&Root);
  FrameCounter = 0;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  ResetTime = (local_18.tv_usec - ((gProfileClock.m_data)->mStartTime).tv_usec) +
              (local_18.tv_sec - ((gProfileClock.m_data)->mStartTime).tv_sec) * 1000000;
  return;
}

Assistant:

void btClock::reset()
{
#ifdef BT_USE_WINDOWS_TIMERS
	QueryPerformanceCounter(&m_data->mStartTime);
	m_data->mStartTick = GetTickCount64();
	m_data->mPrevElapsedTime = 0;
#else
#ifdef __CELLOS_LV2__

	typedef uint64_t  ClockSize;
	ClockSize newTime;
	//__asm __volatile__( "mftb %0" : "=r" (newTime) : : "memory");
	SYS_TIMEBASE_GET( newTime );
	m_data->mStartTime = newTime;
#else
	gettimeofday(&m_data->mStartTime, 0);
#endif
#endif
}